

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::Arguments::~Arguments(Arguments *this)

{
  bool bVar1;
  reference ppcVar2;
  long in_FS_OFFSET;
  Arguments *this_local;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_18;
  iterator i;
  
  i._M_current = *(char ***)(in_FS_OFFSET + 0x28);
  local_18._M_current = (char **)std::vector<char_*,_std::allocator<char_*>_>::begin(&this->args_);
  while( true ) {
    this_local = (Arguments *)std::vector<char_*,_std::allocator<char_*>_>::end(&this->args_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *)
                       &this_local);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator*(&local_18);
    free(*ppcVar2);
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator++
              (&local_18);
  }
  std::vector<char_*,_std::allocator<char_*>_>::~vector(&this->args_);
  if (*(char ***)(in_FS_OFFSET + 0x28) == i._M_current) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Arguments() {
    for (std::vector<char*>::iterator i = args_.begin(); i != args_.end();
         ++i) {
      free(*i);
    }
  }